

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O0

void docs::run(Options *options,thread_pool *pool,Program *prog)

{
  bool bVar1;
  reference this;
  ulong uVar2;
  char *__s;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  string templ;
  DocSection *sec;
  const_iterator __end2;
  const_iterator __begin2;
  vector<docs::DocSection,_std::allocator<docs::DocSection>_> *__range2;
  Doc *doc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<docs::Doc,_std::allocator<docs::Doc>_> *__range1_1;
  anon_class_24_3_0d536c31 local_b8;
  function<void_()> local_a0;
  reference local_80;
  LexData *data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<LexData,_std::allocator<LexData>_> *__range1;
  vector<docs::Doc,_std::allocator<docs::Doc>_> docs;
  mutex docs_mutex;
  Program *prog_local;
  thread_pool *pool_local;
  Options *options_local;
  
  std::mutex::mutex((mutex *)&docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage);
  std::vector<docs::Doc,_std::allocator<docs::Doc>_>::vector
            ((vector<docs::Doc,_std::allocator<docs::Doc>_> *)&__range1);
  __end1 = std::vector<LexData,_std::allocator<LexData>_>::begin(&prog->lex_data);
  data = (LexData *)std::vector<LexData,_std::allocator<LexData>_>::end(&prog->lex_data);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                                *)&data);
    if (!bVar1) break;
    local_b8.data =
         __gnu_cxx::
         __normal_iterator<const_LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
         operator*(&__end1);
    local_b8.docs_mutex =
         (mutex *)&docs.super__Vector_base<docs::Doc,_std::allocator<docs::Doc>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    local_b8.docs = (vector<docs::Doc,_std::allocator<docs::Doc>_> *)&__range1;
    local_80 = local_b8.data;
    std::function<void()>::function<docs::run(Options_const&,thread_pool&,Program_const&)::__0,void>
              ((function<void()> *)&local_a0,&local_b8);
    thread_pool::execute(pool,&local_a0);
    std::function<void_()>::~function(&local_a0);
    __gnu_cxx::__normal_iterator<const_LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
    operator++(&__end1);
  }
  thread_pool::wait_all(pool);
  __end1_1 = std::vector<docs::Doc,_std::allocator<docs::Doc>_>::begin
                       ((vector<docs::Doc,_std::allocator<docs::Doc>_> *)&__range1);
  doc = (Doc *)std::vector<docs::Doc,_std::allocator<docs::Doc>_>::end
                         ((vector<docs::Doc,_std::allocator<docs::Doc>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<docs::Doc_*,_std::vector<docs::Doc,_std::allocator<docs::Doc>_>_>
                        *)&doc);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<docs::Doc_*,_std::vector<docs::Doc,_std::allocator<docs::Doc>_>_>::
           operator*(&__end1_1);
    __end2 = std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::begin
                       (&this->sections);
    sec = (DocSection *)
          std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::end(&this->sections);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_docs::DocSection_*,_std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>_>
                                  *)&sec);
      if (!bVar1) break;
      templ.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_docs::DocSection_*,_std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_128,(string *)&options->print);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"{id}",&local_149);
      replace_string((string *)local_128,&local_148,(string *)(templ.field_2._8_8_ + 8));
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,"{type}",&local_171);
      replace_string((string *)local_128,&local_170,(string *)(templ.field_2._8_8_ + 0x28));
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"{line}",&local_199);
      replace_string((string *)local_128,&local_198,(string *)(templ.field_2._8_8_ + 0x48));
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"{desc}",&local_1c1);
      replace_string((string *)local_128,&local_1c0,(string *)(templ.field_2._8_8_ + 0x68));
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        __s = (char *)std::__cxx11::string::c_str();
        puts(__s);
      }
      std::__cxx11::string::~string((string *)local_128);
      __gnu_cxx::
      __normal_iterator<const_docs::DocSection_*,_std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<docs::Doc_*,_std::vector<docs::Doc,_std::allocator<docs::Doc>_>_>::
    operator++(&__end1_1);
  }
  std::vector<docs::Doc,_std::allocator<docs::Doc>_>::~vector
            ((vector<docs::Doc,_std::allocator<docs::Doc>_> *)&__range1);
  return;
}

Assistant:

void run(
  const Options& options,
  thread_pool& pool,
  const Program& prog)
{
  std::mutex docs_mutex;
  std::vector<Doc> docs;

  for (const auto& data : prog.lex_data) {
    pool.execute(
      [&data, &docs_mutex, &docs]() {
        Doc doc = process_file(data);
        {
          std::unique_lock<std::mutex> l(docs_mutex);
          docs.emplace_back(std::move(doc));
        }
      });
  }

  pool.wait_all();

  // Generate markdown file

  for (const Doc& doc : docs) {
    for (const DocSection& sec : doc.sections) {
      std::string templ = options.print;
      replace_string(templ, "{id}", sec.id);
      replace_string(templ, "{type}", sec.type);
      replace_string(templ, "{line}", sec.line);
      replace_string(templ, "{desc}", sec.desc);
      if (!templ.empty())
        std::puts(templ.c_str());
    }
  }
}